

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elftool.cpp
# Opt level: O0

void printSectionHeaders(ElfImage *image)

{
  bool bVar1;
  size_t sVar2;
  uint64_t uVar3;
  reference ppEVar4;
  string *this;
  undefined8 uVar5;
  ElfSection *section;
  iterator __end1;
  iterator __begin1;
  ElfImage *__range1;
  uint i;
  ElfImage *image_local;
  
  sVar2 = libelfxx::ElfImage::sectionNum(image);
  uVar3 = libelfxx::ElfImage::phoff(image);
  printf("There are %zu section headers, starting at offset 0x%lx:\n\n",sVar2,uVar3);
  printf("Section Headers:\n");
  printf("  [Nr] Name              Type            Addr     Off    Size   ES Flg Lk Inf Al\n");
  __range1._4_4_ = 0;
  __end1 = libelfxx::ElfImage::begin(image);
  section = (ElfSection *)libelfxx::ElfImage::end(image);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<libelfxx::ElfSection_**,_std::vector<libelfxx::ElfSection_*,_std::allocator<libelfxx::ElfSection_*>_>_>
                                *)&section);
    if (!bVar1) break;
    ppEVar4 = __gnu_cxx::
              __normal_iterator<libelfxx::ElfSection_**,_std::vector<libelfxx::ElfSection_*,_std::allocator<libelfxx::ElfSection_*>_>_>
              ::operator*(&__end1);
    this = libelfxx::ElfSection::name_abi_cxx11_(*ppEVar4);
    uVar5 = std::__cxx11::string::c_str((string *)this);
    printf("  [%2u] %s\n",(ulong)__range1._4_4_,uVar5);
    __gnu_cxx::
    __normal_iterator<libelfxx::ElfSection_**,_std::vector<libelfxx::ElfSection_*,_std::allocator<libelfxx::ElfSection_*>_>_>
    ::operator++(&__end1);
    __range1._4_4_ = __range1._4_4_ + 1;
  }
  printf(
        "Key to Flags:\n  W (write), A (alloc), X (execute), M (merge), S (strings)\n  I (info), L (link order), G (group), T (TLS), E (exclude), x (unknown)\n  O (extra OS processing required) o (OS specific), p (processor specific)\n"
        );
  return;
}

Assistant:

static void
printSectionHeaders(libelfxx::ElfImage *image) {
  printf("There are %zu section headers, starting at offset 0x%" PRIx64 ":\n\n",
         image->sectionNum(), image->phoff());
  printf("Section Headers:\n");
  printf("  [Nr] Name              Type            Addr     Off    Size"
         "   ES Flg Lk Inf Al\n");
  unsigned i = 0;
  for (auto section : *image) {
    printf("  [%2u] %s\n", i++, section->name().c_str());
  }
  printf("Key to Flags:\n"
         "  W (write), A (alloc), X (execute), M (merge), S (strings)\n"
         "  I (info), L (link order), G (group), T (TLS), E (exclude),"
         " x (unknown)\n"
         "  O (extra OS processing required) o (OS specific),"
         " p (processor specific)\n");
}